

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O0

void __thiscall
pbrt::RGBColorSpace::RGBColorSpace
          (RGBColorSpace *this,Point2f r,Point2f g,Point2f b,SpectrumHandle *illuminant,
          RGBToSpectrumTable *rgbToSpectrumTable,Allocator alloc)

{
  Point2f xy;
  Point2f xy_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Float *pFVar6;
  SquareMatrix<3> *pSVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  Point2f PVar8;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar10;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  XYZ XVar12;
  XYZ XVar13;
  SquareMatrix<3> *in_stack_000000e8;
  XYZ C;
  SquareMatrix<3> rgb;
  XYZ B;
  XYZ G;
  XYZ R;
  XYZ W;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  float in_stack_fffffffffffffd30;
  float in_stack_fffffffffffffd34;
  float in_stack_fffffffffffffd38;
  float in_stack_fffffffffffffd3c;
  Float args_1;
  SpectrumHandle *in_stack_fffffffffffffd40;
  float in_stack_fffffffffffffd48;
  Float in_stack_fffffffffffffd4c;
  Allocator in_stack_fffffffffffffd50;
  float in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined8 local_184;
  undefined8 uStack_17c;
  undefined8 uStack_174;
  undefined8 uStack_16c;
  undefined4 local_164;
  XYZ local_128 [4];
  undefined8 local_f8;
  Float local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  Float local_d8;
  undefined8 local_d0;
  Float local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  Float local_b0;
  undefined8 local_a8;
  Float local_a0;
  undefined8 local_98;
  undefined8 local_90;
  Float local_88;
  undefined8 local_80;
  undefined8 local_78;
  Float local_70;
  undefined8 local_60;
  Float local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar11 [56];
  
  auVar11 = in_ZMM0._8_56_;
  local_8 = vmovlpd_avx(in_ZMM0._0_16_);
  local_10 = vmovlpd_avx(in_ZMM1._0_16_);
  local_18 = vmovlpd_avx(in_ZMM2._0_16_);
  *in_RDI = local_8;
  in_RDI[1] = local_10;
  in_RDI[2] = local_18;
  local_38 = in_RDX;
  local_20 = in_RCX;
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             (SpectrumHandle *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  local_48 = local_20;
  DenselySampledSpectrum::DenselySampledSpectrum
            ((DenselySampledSpectrum *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
             ,in_stack_fffffffffffffd40,in_stack_fffffffffffffd50);
  SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)(in_RDI + 9));
  SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)((long)in_RDI + 0x6c));
  in_RDI[0x12] = local_38;
  SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             (SpectrumHandle *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  XVar12 = SpectrumToXYZ((SpectrumHandle *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  local_70 = XVar12.Z;
  auVar9._0_8_ = XVar12._0_8_;
  auVar9._8_56_ = auVar11;
  local_78 = vmovlpd_avx(auVar9._0_16_);
  local_60 = local_78;
  local_58 = local_70;
  PVar8 = XYZ::xy((XYZ *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  auVar5._8_8_ = extraout_XMM0_Qb;
  auVar5._0_4_ = PVar8.super_Tuple2<pbrt::Point2,_float>.x;
  auVar5._4_4_ = PVar8.super_Tuple2<pbrt::Point2,_float>.y;
  local_80 = vmovlpd_avx(auVar5);
  in_RDI[3] = local_80;
  local_98 = local_8;
  uVar10 = 0;
  PVar8.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffd38;
  PVar8.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffd34;
  XVar12 = XYZ::FromxyY(PVar8,in_stack_fffffffffffffd30);
  local_a0 = XVar12.Z;
  auVar4._8_8_ = uVar10;
  auVar4._0_8_ = XVar12._0_8_;
  local_a8 = vmovlpd_avx(auVar4);
  local_c0 = local_10;
  pSVar7 = (SquareMatrix<3> *)0x0;
  xy.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffd38;
  xy.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffd34;
  local_90 = local_a8;
  local_88 = local_a0;
  XVar12 = XYZ::FromxyY(xy,in_stack_fffffffffffffd30);
  local_c8 = XVar12.Z;
  auVar3._8_8_ = pSVar7;
  auVar3._0_8_ = XVar12._0_8_;
  local_d0 = vmovlpd_avx(auVar3);
  local_e8 = local_18;
  uVar10 = 0;
  xy_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffd38;
  xy_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffd34;
  local_b8 = local_d0;
  local_b0 = local_c8;
  XVar13 = XYZ::FromxyY(xy_00,in_stack_fffffffffffffd30);
  local_f0 = XVar13.Z;
  auVar2._8_8_ = uVar10;
  auVar2._0_8_ = XVar13._0_8_;
  local_f8 = vmovlpd_avx(auVar2);
  uVar10 = 0;
  local_e0 = local_f8;
  local_d8 = local_f0;
  SquareMatrix<3>::SquareMatrix<float,float,float,float,float,float,float,float>
            ((SquareMatrix<3> *)in_stack_fffffffffffffd50.memoryResource,in_stack_fffffffffffffd4c,
             in_stack_fffffffffffffd48,(float)((ulong)in_stack_fffffffffffffd40 >> 0x20),
             SUB84(in_stack_fffffffffffffd40,0),in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd34,in_stack_fffffffffffffd30,in_stack_fffffffffffffd60);
  Inverse<3>(in_stack_000000e8);
  pstd::optional<pbrt::SquareMatrix<3>_>::operator*((optional<pbrt::SquareMatrix<3>_> *)0x4a09b6);
  XVar13 = pbrt::operator*((SquareMatrix<3> *)in_stack_fffffffffffffd50.memoryResource,
                           (XYZ *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  local_128[0].Z = XVar13.Z;
  auVar1._8_8_ = uVar10;
  auVar1._0_8_ = XVar13._0_8_;
  local_128[0]._0_8_ = vmovlpd_avx(auVar1);
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional((optional<pbrt::SquareMatrix<3>_> *)0x4a0a26);
  XYZ::operator[](local_128,0);
  pFVar6 = XYZ::operator[](local_128,1);
  args_1 = *pFVar6;
  pFVar6 = XYZ::operator[](local_128,2);
  SquareMatrix<3>::Diag<float,float>((Float)((ulong)pFVar6 >> 0x20),SUB84(pFVar6,0),args_1);
  pbrt::operator*(pSVar7,XVar12._0_8_);
  *(undefined4 *)(in_RDI + 0xd) = local_164;
  in_RDI[9] = local_184;
  in_RDI[10] = uStack_17c;
  in_RDI[0xb] = uStack_174;
  in_RDI[0xc] = uStack_16c;
  Inverse<3>(in_stack_000000e8);
  pSVar7 = pstd::optional<pbrt::SquareMatrix<3>_>::operator*
                     ((optional<pbrt::SquareMatrix<3>_> *)0x4a0b15);
  memcpy((void *)((long)in_RDI + 0x6c),pSVar7,0x24);
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional((optional<pbrt::SquareMatrix<3>_> *)0x4a0b44);
  return;
}

Assistant:

RGBColorSpace::RGBColorSpace(Point2f r, Point2f g, Point2f b, SpectrumHandle illuminant,
                             const RGBToSpectrumTable *rgbToSpectrumTable,
                             Allocator alloc)
    : r(r),
      g(g),
      b(b),
      illuminant(illuminant, alloc),
      rgbToSpectrumTable(rgbToSpectrumTable) {
    // Compute whitepoint primaries
    XYZ W = SpectrumToXYZ(illuminant);
    w = W.xy();

    // Compute XYZ coordinates of primaries
    XYZ R = XYZ::FromxyY(r), G = XYZ::FromxyY(g), B = XYZ::FromxyY(b);

    // Compute _XYZFromRGB_ matrix for color space
    SquareMatrix<3> rgb(R.X, G.X, B.X, R.Y, G.Y, B.Y, R.Z, G.Z, B.Z);
    XYZ C = *Inverse(rgb) * W;
    XYZFromRGB = rgb * SquareMatrix<3>::Diag(C[0], C[1], C[2]);

    // Compute _RGBFromXYZ_ matrix for color space
    RGBFromXYZ = *Inverse(XYZFromRGB);
}